

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

int float32_unordered_x86_64(float32 a,float32 b,float_status *status)

{
  float32 fVar1;
  float32 fVar2;
  int iVar3;
  
  fVar1 = float32_squash_input_denormal_x86_64(a,status);
  fVar2 = float32_squash_input_denormal_x86_64(b,status);
  if (((~fVar1 & 0x7f800000) == 0 && (fVar1 & 0x7fffff) != 0) ||
     (iVar3 = 0, (fVar2 & 0x7fffff) != 0 && (~fVar2 & 0x7f800000) == 0)) {
    status->float_exception_flags = status->float_exception_flags | 1;
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int float32_unordered(float32 a, float32 b, float_status *status)
{
    a = float32_squash_input_denormal(a, status);
    b = float32_squash_input_denormal(b, status);

    if (    ( ( extractFloat32Exp( a ) == 0xFF ) && extractFloat32Frac( a ) )
         || ( ( extractFloat32Exp( b ) == 0xFF ) && extractFloat32Frac( b ) )
       ) {
        float_raise(float_flag_invalid, status);
        return 1;
    }
    return 0;
}